

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O0

functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> *
ising::free_energy::triangular::(anonymous_namespace)::
func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (double Ja,double Jb,double Jc,fvar<double,_2UL> beta)

{
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> *in_RDI;
  double in_stack_00000218;
  double in_stack_00000220;
  double in_stack_00000228;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
  *in_stack_00000230;
  fvar<double,_2UL> in_stack_00000240;
  
  anon_unknown_1::
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::functor
            (in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_00000218,
             in_stack_00000240);
  return in_RDI;
}

Assistant:

functor<T, FVAR> func(T Ja, T Jb, T Jc, FVAR beta) {
  return functor<T, FVAR>(Ja, Jb, Jc, beta);
}